

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int insertkey(Table *t,TValue *key,TValue *value)

{
  long lVar1;
  long lVar2;
  lu_byte lVar3;
  lu_byte lVar4;
  undefined2 uVar5;
  int iVar6;
  Node *pNVar7;
  long lVar8;
  Node *pNVar9;
  Node *pNVar10;
  TValue *io2;
  TValue *io_;
  Node *pNVar11;
  TValue *io__1;
  Node *n_;
  Value local_38;
  lu_byte local_30;
  
  pNVar7 = mainpositionTV(t,key);
  if ((((pNVar7->u).tt_ & 0xf) != 0) || (pNVar11 = pNVar7, (t->flags & 0x40) != 0)) {
    if (t->lsizenode < 3) {
      lVar8 = (1L << (t->lsizenode & 0x3f)) * 0x18;
      do {
        lVar1 = lVar8 + -0x18;
        if (lVar1 == -0x18) {
          return 0;
        }
        lVar2 = lVar8 + -0xf;
        lVar8 = lVar1;
      } while (*(char *)((long)t->node + lVar2) != '\0');
      pNVar11 = (Node *)((long)t->node + lVar1);
    }
    else {
      do {
        pNVar9 = t->node;
        pNVar10 = *(Node **)((long)pNVar9 - 8);
        if (pNVar10 <= pNVar9) {
          return 0;
        }
        pNVar11 = pNVar10 + -1;
        *(Node **)((long)pNVar9 - 8) = pNVar11;
      } while (*(char *)((long)pNVar10 - 0xf) != '\0');
    }
    local_38 = (pNVar7->u).key_val;
    local_30 = (pNVar7->u).key_tt;
    pNVar9 = mainpositionTV(t,(TValue *)&local_38);
    if (pNVar9 == pNVar7) {
      if ((long)(pNVar7->u).next != 0) {
        (pNVar11->u).next =
             (int)(((long)pNVar7 + ((long)(pNVar7->u).next * 0x18 - (long)pNVar11)) / 0x18);
      }
      (pNVar7->u).next = (int)(((long)pNVar11 - (long)pNVar7) / 0x18);
    }
    else {
      do {
        pNVar10 = pNVar9;
        pNVar9 = pNVar10 + (pNVar10->u).next;
      } while (pNVar10 + (pNVar10->u).next != pNVar7);
      (pNVar10->u).next = (int)(((long)pNVar11 - (long)pNVar10) / 0x18);
      (pNVar11->u).key_val = (pNVar7->u).key_val;
      lVar3 = *(lu_byte *)((long)pNVar7 + 8);
      lVar4 = *(lu_byte *)((long)pNVar7 + 9);
      uVar5 = *(undefined2 *)((long)pNVar7 + 10);
      iVar6 = *(int *)((long)pNVar7 + 0xc);
      (pNVar11->u).value_ = (pNVar7->u).value_;
      *(lu_byte *)((long)pNVar11 + 8) = lVar3;
      *(lu_byte *)((long)pNVar11 + 9) = lVar4;
      *(undefined2 *)((long)pNVar11 + 10) = uVar5;
      *(int *)((long)pNVar11 + 0xc) = iVar6;
      if ((pNVar7->u).next != 0) {
        (pNVar11->u).next = (pNVar11->u).next + (int)(((long)pNVar7 - (long)pNVar11) / 0x18);
        (pNVar7->u).next = 0;
      }
      (pNVar7->u).tt_ = '\x10';
      pNVar11 = pNVar7;
    }
  }
  (pNVar11->u).key_val = key->value_;
  (pNVar11->u).key_tt = key->tt_;
  (pNVar11->u).value_ = value->value_;
  (pNVar11->u).tt_ = value->tt_;
  return 1;
}

Assistant:

static int insertkey (Table *t, const TValue *key, TValue *value) {
  Node *mp = mainpositionTV(t, key);
  /* table cannot already contain the key */
  lua_assert(isabstkey(getgeneric(t, key, 0)));
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL)  /* cannot find a free place? */
      return 0;
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(mp, key);
  lua_assert(isempty(gval(mp)));
  setobj2t(cast(lua_State *, 0), gval(mp), value);
  return 1;
}